

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SubDEdgeSharpness *chain_edge_sharpness)

{
  double sharpness;
  double *pdVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  float *pfVar4;
  uint uVar5;
  float fVar7;
  double dVar8;
  double dVar9;
  ON_SubDEdgeSharpness OVar10;
  ON_Interval r;
  ON_Interval local_58;
  ON_Interval local_48;
  double local_38;
  ulong uVar6;
  
  pfVar4 = (float *)CONCAT44(in_register_00000034,edge_count);
  local_58.m_t[1] = chain_sharpness_range.m_t[1];
  local_58.m_t[0] = chain_sharpness_range.m_t[0];
  uVar6 = (ulong)this & 0xffffffff;
  uVar5 = (uint)this;
  uVar3 = 0;
  if (pfVar4 != (float *)0x0 && 1 < uVar5 + 1) {
    uVar3 = 0;
    pdVar1 = ON_Interval::operator[](&local_58,0);
    dVar8 = *pdVar1;
    pdVar1 = ON_Interval::operator[](&local_58,1);
    dVar9 = *pdVar1;
    pdVar1 = ON_Interval::operator[](&local_58,0);
    sharpness = *pdVar1;
    if ((dVar8 != dVar9) || (NAN(dVar8) || NAN(dVar9))) {
      if ((0.0 <= sharpness) && (sharpness <= 4.0)) {
        pdVar1 = ON_Interval::operator[](&local_58,1);
        dVar8 = ON_DBL_QNAN;
        if ((0.0 <= *pdVar1) && (*pdVar1 <= 4.0)) {
          pdVar1 = ON_Interval::operator[](&local_58,0);
          ON_Interval::ON_Interval(&local_48,dVar8,*pdVar1);
          if (uVar5 != 0) {
            local_38 = (double)uVar6;
            uVar2 = 1;
            do {
              local_48.m_t[0] = local_48.m_t[1];
              if (uVar2 < uVar6) {
                local_48.m_t[1] =
                     ON_Interval::ParameterAt(&local_58,(double)(uVar2 & 0xffffffff) / local_38);
              }
              else {
                pdVar1 = ON_Interval::operator[](&local_58,1);
                local_48.m_t[1] = *pdVar1;
              }
              dVar8 = ON_Interval::operator[](&local_48,0);
              dVar9 = ON_Interval::operator[](&local_48,1);
              OVar10 = FromInterval(dVar8,dVar9);
              if (OVar10.m_edge_sharpness[0] < 0.0) {
                return 0;
              }
              if (4.0 < OVar10.m_edge_sharpness[0]) {
                return 0;
              }
              if (OVar10.m_edge_sharpness[1] < 0.0) {
                return 0;
              }
              if (4.0 < OVar10.m_edge_sharpness[1]) {
                return 0;
              }
              *(float (*) [2])(pfVar4 + uVar2 * 2 + -2) = OVar10.m_edge_sharpness;
              uVar2 = uVar2 + 1;
            } while ((int)uVar2 - uVar5 != 1);
          }
          uVar3 = 1;
          if (*pfVar4 != pfVar4[(ulong)(uVar5 - 1) * 2 + 1]) {
            uVar3 = uVar5;
          }
          if (NAN(*pfVar4) || NAN(pfVar4[(ulong)(uVar5 - 1) * 2 + 1])) {
            uVar3 = uVar5;
          }
        }
      }
    }
    else {
      if ((sharpness < 0.0) || (4.0 < sharpness)) {
        fVar7 = ON_FLT_QNAN;
        if ((sharpness == 5.0) && (!NAN(sharpness))) {
          fVar7 = 5.0;
        }
      }
      else {
        dVar8 = Sanitize(sharpness,0.0);
        fVar7 = (float)dVar8;
      }
      if ((((fVar7 == 5.0) && (!NAN(fVar7))) || ((uVar3 = 0, 0.0 <= fVar7 && (fVar7 <= 4.0)))) &&
         (uVar3 = 1, uVar5 != 0)) {
        uVar2 = 0;
        do {
          *(ulong *)(pfVar4 + uVar2 * 2) = CONCAT44(fVar7,fVar7);
          uVar2 = uVar2 + 1;
        } while (uVar6 != uVar2);
      }
    }
  }
  return uVar3;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SubDEdgeSharpness* chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX || nullptr == chain_edge_sharpness)
    return 0;

  if (chain_sharpness_range[0] == chain_sharpness_range[1])
  {
    const ON_SubDEdgeSharpness c = ON_SubDEdgeSharpness::FromConstant(chain_sharpness_range[0]);
    if (false == c.IsValid(true))
      return 0;
    for (unsigned i = 0; i < edge_count; ++i)
      chain_edge_sharpness[i] = c;
    return 1;
  }

  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[0], false))
    return false;
  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[1], false))
    return false;

  const double d = (double)edge_count;
  ON_Interval r(ON_DBL_QNAN, chain_sharpness_range[0]);
  for (unsigned i = 1; i <= edge_count; ++i)
  {
    r.m_t[0] = r.m_t[1];
    r.m_t[1]
      = (i < edge_count)
      ? chain_sharpness_range.ParameterAt(((double)i / d))
      : chain_sharpness_range[1];
    const ON_SubDEdgeSharpness v = ON_SubDEdgeSharpness::FromInterval(r);
    if (v.IsValid())
    {
      chain_edge_sharpness[i - 1] = v;
      continue;
    }
    return 0;
  }

  return
    (chain_edge_sharpness[0].EndSharpness(0) != chain_edge_sharpness[edge_count - 1].EndSharpness(1))
    ? edge_count
    : 1;
}